

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_dirt.cc
# Opt level: O1

void __thiscall FilesystemDirt::AddDirtyPath(FilesystemDirt *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  ulong uVar5;
  long lVar6;
  size_t *psVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_bool>
  pVar8;
  string remainder;
  string first;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
  local_b0;
  allocator local_58 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
  local_50;
  
  if (this->dirty_ == false) {
    if (path->_M_string_length == 0) {
      this->dirty_ = true;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
      ::clear(&(this->children_)._M_t);
      return;
    }
    uVar5 = std::__cxx11::string::find_first_not_of((char)path,0x2f);
    lVar6 = std::__cxx11::string::find((char)path,0x2f);
    std::__cxx11::string::string((string *)&local_d0,(string *)path,uVar5,lVar6 - uVar5);
    paVar1 = &local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    if (lVar6 != -1) {
      std::__cxx11::string::string((string *)&local_b0,(string *)path,lVar6 + 1,local_58);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
        operator_delete(local_b0.first._M_dataplus._M_p,
                        local_b0.first.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var4 = &local_50._M_impl.super__Rb_tree_header;
    local_58[0] = (allocator)0x0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    paVar2 = &local_b0.first.field_2;
    local_b0.first._M_dataplus._M_p = (pointer)paVar2;
    local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0,local_c8 + (long)local_d0);
    p_Var3 = &local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b0.second.dirty_ = (bool)local_58[0];
    if (local_50._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar7 = (size_t *)
               ((long)&local_b0.second.children_._M_t._M_impl.super__Rb_tree_header + 0x20);
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
    }
    else {
      psVar7 = &local_50._M_impl.super__Rb_tree_header._M_node_count;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_50._M_impl.super__Rb_tree_header._M_header._M_color;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_50._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var3;
      local_b0.second.children_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_50._M_impl.super__Rb_tree_header._M_node_count;
      local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    }
    *psVar7 = 0;
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,FilesystemDirt>,std::_Select1st<std::pair<std::__cxx11::string_const,FilesystemDirt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,FilesystemDirt>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,FilesystemDirt>,std::_Select1st<std::pair<std::__cxx11::string_const,FilesystemDirt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
                        *)&this->children_,&local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
    ::~_Rb_tree(&local_b0.second.children_._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
    ::~_Rb_tree(&local_50);
    AddDirtyPath((FilesystemDirt *)(pVar8.first._M_node._M_node + 2),&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  return;
}

Assistant:

void FilesystemDirt::AddDirtyPath(const std::string& path) {
  if (!dirty_) {
    if (path.empty()) {
      // No further pathname components. Mark this file dirty.
      dirty_ = true;
      children_.clear();
    } else {
      // Extract first pathname component from input path.
      std::size_t nonslash = path.find_first_not_of('/');
      std::size_t slash = path.find('/', nonslash);
      std::string first(path, nonslash, slash - nonslash);
      std::string remainder;
      if (slash != std::string::npos)
        remainder = std::string(path, slash + 1);

      // Continue to next pathname component.
      auto child = children_.insert({first, FilesystemDirt()});
      child.first->second.AddDirtyPath(remainder);
    }
  }
}